

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall
phosg::Image::blit(Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,
                  ssize_t sy)

{
  long y_00;
  uint64_t a_00;
  long x_00;
  ssize_t xx;
  long lVar1;
  long lVar2;
  long x_01;
  ssize_t x_02;
  long lVar3;
  bool bVar4;
  uint64_t a;
  uint64_t b;
  uint64_t g;
  uint64_t r;
  uint64_t sa;
  uint64_t sb;
  uint64_t sg;
  uint64_t sr;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ssize_t local_b0;
  ssize_t local_a8;
  ssize_t local_a0;
  ssize_t local_98;
  ssize_t local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  ssize_t local_68;
  uint local_60 [2];
  uint local_58 [2];
  uint local_50 [2];
  uint local_48 [2];
  ssize_t local_40;
  ssize_t local_38;
  
  local_a0 = w;
  if (w < 0) {
    local_a0 = source->width;
  }
  local_a8 = h;
  if (h < 0) {
    local_a8 = source->height;
  }
  local_40 = y;
  local_38 = x;
  clamp_blit_dimensions(this,source,&local_38,&local_40,&local_a0,&local_a8,&sx,&sy);
  local_88 = sx;
  local_90 = sy;
  local_b0 = local_38;
  local_98 = local_40;
  local_70 = 0;
  local_80 = local_a0;
  if (local_a0 < 1) {
    local_80 = local_70;
  }
  local_78 = local_a8;
  if (local_a8 < 1) {
    local_78 = local_70;
  }
  for (; local_70 != local_78; local_70 = local_70 + 1) {
    local_68 = local_90 + local_70;
    y_00 = local_98 + local_70;
    lVar1 = 0;
    x_01 = local_88;
    x_02 = local_b0;
    lVar3 = local_80;
    while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
      read_pixel(source,x_01,local_68,&local_b8,&local_c0,&local_c8,&local_d0);
      if (local_d0 != 0) {
        if (local_d0 == 0xff) {
          a_00 = 0xff;
          x_00 = x_02;
        }
        else {
          x_00 = local_b0 + lVar1;
          read_pixel(this,x_02,y_00,(uint64_t *)local_48,(uint64_t *)local_50,(uint64_t *)local_58,
                     (uint64_t *)local_60);
          lVar2 = 0xff - local_d0;
          local_b8 = ((ulong)local_48[0] * lVar2 + (local_b8 & 0xffffffff) * local_d0) / 0xff;
          local_c0 = ((ulong)local_50[0] * lVar2 + (local_c0 & 0xffffffff) * local_d0) / 0xff;
          local_c8 = ((ulong)local_58[0] * lVar2 + (local_c8 & 0xffffffff) * local_d0) / 0xff;
          a_00 = ((ulong)local_60[0] * lVar2 + (local_d0 & 0xffffffff) * local_d0) / 0xff;
          local_d0 = a_00;
        }
        write_pixel(this,x_00,y_00,local_b8,local_c0,local_c8,a_00);
      }
      lVar1 = lVar1 + 1;
      x_02 = x_02 + 1;
      x_01 = x_01 + 1;
    }
  }
  return;
}

Assistant:

void Image::blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy) {

  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (ssize_t yy = 0; yy < h; yy++) {
    for (ssize_t xx = 0; xx < w; xx++) {
      uint64_t r, g, b, a;
      source.read_pixel(sx + xx, sy + yy, &r, &g, &b, &a);
      if (a == 0) {
        continue;
      }
      if (a != 0xFF) {
        uint64_t sr, sg, sb, sa;
        this->read_pixel(x + xx, y + yy, &sr, &sg, &sb, &sa);
        r = (a * (uint32_t)r + (0xFF - a) * (uint32_t)sr) / 0xFF;
        g = (a * (uint32_t)g + (0xFF - a) * (uint32_t)sg) / 0xFF;
        b = (a * (uint32_t)b + (0xFF - a) * (uint32_t)sb) / 0xFF;
        a = (a * (uint32_t)a + (0xFF - a) * (uint32_t)sa) / 0xFF;
      }
      this->write_pixel(x + xx, y + yy, r, g, b, a);
    }
  }
}